

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool ignore_sval_menu_action(menu_conflict *m,ui_event *event,wchar_t oid)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  object_kind *kind;
  ignore_choice *choice;
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict *m_local;
  
  pvVar3 = menu_priv(m);
  if (event->type == EVT_SELECT) {
LAB_00265707:
    lVar1 = *(long *)((long)pvVar3 + (long)oid * 0x10);
    if ((*(byte *)((long)pvVar3 + (long)oid * 0x10 + 8) & 1) == 0) {
      *(byte *)(lVar1 + 0x2ba) = *(byte *)(lVar1 + 0x2ba) ^ 2;
    }
    else {
      *(byte *)(lVar1 + 0x2ba) = *(byte *)(lVar1 + 0x2ba) ^ 1;
    }
    player->upkeep->notice = player->upkeep->notice | 2;
    m_local._7_1_ = true;
  }
  else {
    if (event->type == EVT_KBRD) {
      iVar2 = tolower((event->key).code);
      if (iVar2 == 0x74) goto LAB_00265707;
    }
    m_local._7_1_ = false;
  }
  return m_local._7_1_;
}

Assistant:

static bool ignore_sval_menu_action(struct menu *m, const ui_event *event,
									int oid)
{
	const ignore_choice *choice = menu_priv(m);

	if (event->type == EVT_SELECT ||
			(event->type == EVT_KBRD && tolower(event->key.code) == 't')) {
		struct object_kind *kind = choice[oid].kind;

		/* Toggle the appropriate flag */
		if (choice[oid].aware)
			kind->ignore ^= IGNORE_IF_AWARE;
		else
			kind->ignore ^= IGNORE_IF_UNAWARE;

		player->upkeep->notice |= PN_IGNORE;
		return true;
	}

	return false;
}